

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O0

point dlib::
      max_point<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
                (matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                 *m)

{
  const_ret_type pfVar1;
  long lVar2;
  float *pfVar3;
  long extraout_RDX;
  vector<long,_2L> *in_RDI;
  point pVar4;
  type temp;
  long c;
  long r;
  type val;
  point *best_point;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  *this;
  vector<long,_2L> *item;
  vector<long,_2L> *_x;
  vector<long,_2L> *in_stack_ffffffffffffffc0;
  float local_2c;
  matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  *local_28;
  vector<long,_2L> *local_20;
  float local_14 [5];
  
  _x = in_RDI;
  vector<long,_2L>::vector(in_stack_ffffffffffffffc0,(long)in_RDI,(long)in_RDI);
  pfVar1 = matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
           ::operator()(in_stack_ffffffffffffffa0,
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0x25d678);
  local_14[0] = *pfVar1;
  local_20 = (vector<long,_2L> *)0x0;
  while( true ) {
    item = local_20;
    lVar2 = matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
            ::nr((matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                  *)0x25d69f);
    if (lVar2 <= (long)item) break;
    local_28 = (matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                *)0x0;
    while( true ) {
      this = local_28;
      lVar2 = matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
              ::nc((matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                    *)0x25d6cd);
      if (lVar2 <= (long)this) break;
      pfVar1 = matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
               ::operator()(this,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            0x25d6f2);
      local_2c = *pfVar1;
      pfVar3 = impl::magnitude<float>(&local_2c);
      in_stack_ffffffffffffff9c = *pfVar3;
      pfVar3 = impl::magnitude<float>(local_14);
      if (*pfVar3 < in_stack_ffffffffffffff9c) {
        local_14[0] = local_2c;
        vector<long,_2L>::vector(in_stack_ffffffffffffffc0,(long)_x,(long)in_RDI);
        vector<long,_2L>::operator=(in_RDI,item);
      }
      local_28 = local_28 + 1;
    }
    local_20 = (vector<long,_2L> *)
               ((long)(local_20->
                      super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                      ).data.data + 1);
  }
  pVar4.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[1] = extraout_RDX;
  pVar4.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = (long)_x;
  return (point)pVar4.
                super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                .data.data;
}

Assistant:

point max_point (
        const matrix_exp<EXP>& m
    )
    {
        DLIB_ASSERT(m.size() > 0, 
            "\tpoint max_point(const matrix_exp& m)"
            << "\n\tm can't be empty"
            << "\n\tm.size():   " << m.size() 
            << "\n\tm.nr():     " << m.nr() 
            << "\n\tm.nc():     " << m.nc() 
            );
        typedef typename matrix_exp<EXP>::type type;

        point best_point(0,0);
        type val = m(0,0);
        for (long r = 0; r < m.nr(); ++r)
        {
            for (long c = 0; c < m.nc(); ++c)
            {
                type temp = m(r,c);
                if (dlib::impl::magnitude(temp) > dlib::impl::magnitude(val))
                {
                    val = temp;
                    best_point = point(c,r);
                }
            }
        }
        return best_point;
    }